

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_crypto_aes(DisasContext_conflict1 *s,uint32_t insn)

{
  wchar_t val;
  TCGContext_conflict1 *tcg_ctx;
  code *pcVar1;
  TCGContext_conflict1 *pTVar2;
  uint uVar3;
  ulong uVar4;
  TCGTemp *pTVar5;
  TCGv_i32 pTVar6;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  
  if ((((insn & 0xc00000) != 0) || ((s->isar->id_aa64isar0 & 0xf0) == 0)) ||
     (uVar3 = (insn >> 0xc & 0x1f) - 4, 3 < (ushort)uVar3)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  tcg_ctx = s->uc->tcg_ctx;
  uVar4 = (ulong)(uVar3 & 0xffff);
  val = L"CEGIDFHI"[uVar4 + 8];
  pcVar1 = (code *)(&PTR_gen_helper_crypto_aese_010742f0)[uVar4];
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  pTVar2 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar5 - (long)pTVar2);
  tcg_gen_addi_i64_aarch64
            (pTVar2,ret,(TCGv_i64)pTVar2->cpu_env,(ulong)((insn & 0x1f) * 0x100 + 0xc10));
  pTVar2 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar5 - (long)pTVar2);
  tcg_gen_addi_i64_aarch64
            (pTVar2,ret_00,(TCGv_i64)pTVar2->cpu_env,(ulong)((insn & 0x3e0) * 8 + 0xc10));
  pTVar6 = tcg_const_i32_aarch64(tcg_ctx,val);
  (*pcVar1)(tcg_ctx,ret,ret_00,pTVar6);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
  return;
}

Assistant:

static void disas_crypto_aes(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int decrypt;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    TCGv_i32 tcg_decrypt;
    CryptoThreeOpIntFn *genfn;

    if (!dc_isar_feature(aa64_aes, s) || size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x4: /* AESE */
        decrypt = 0;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x6: /* AESMC */
        decrypt = 0;
        genfn = gen_helper_crypto_aesmc;
        break;
    case 0x5: /* AESD */
        decrypt = 1;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x7: /* AESIMC */
        decrypt = 1;
        genfn = gen_helper_crypto_aesmc;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_decrypt = tcg_const_i32(tcg_ctx, decrypt);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_decrypt);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_i32(tcg_ctx, tcg_decrypt);
}